

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::JobManager::CollectJobsValue(Value *__return_storage_ptr__,JobManager *this)

{
  pointer ppJVar1;
  bool bVar2;
  uint64_t uVar3;
  reference this_00;
  pointer ppJVar4;
  json json;
  input_adapter local_138;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_128;
  string valueStr;
  _Any_data local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  string_t local_d8;
  Value local_b8;
  string local_70 [2];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&json,(nullptr_t)0x0);
  ppJVar4 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppJVar1 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppJVar4 == ppJVar1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump(&local_d8,&json,4,' ',false,strict);
      Interpreter::Value::Value(&local_b8,&local_d8);
      Interpreter::Value::operator=(__return_storage_ptr__,&local_b8);
      Interpreter::Value::~Value(&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&json);
      return __return_storage_ptr__;
    }
    bVar2 = Job::IsStopped(*ppJVar4);
    if (!bVar2) break;
    Job::GetValue(&local_b8,*ppJVar4);
    bVar2 = Interpreter::Value::HasNoError(&local_b8);
    Interpreter::Value::~Value(&local_b8);
    if (bVar2) {
      uVar3 = Job::GetXpanId(*ppJVar4);
      Job::GetValue(&local_b8,*ppJVar4);
      Interpreter::Value::ToString_abi_cxx11_(&valueStr,&local_b8);
      Interpreter::Value::~Value(&local_b8);
      if (valueStr._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&valueStr);
      }
      nlohmann::detail::input_adapter::
      input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_138,&valueStr);
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8._M_unused._M_object = (void *)0x0;
      local_f8._8_8_ = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse(&local_128,&local_138,(parser_callback_t *)&local_f8,true);
      utils::Hex<unsigned_long>((string *)&local_b8,uVar3);
      this_00 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](&json,(key_type *)&local_b8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(this_00,&local_128);
      std::__cxx11::string::~string((string *)&local_b8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_128);
      std::_Function_base::~_Function_base((_Function_base *)&local_f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_138.ia.
                  super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&valueStr);
    }
    else {
      uVar3 = Job::GetXpanId(*ppJVar4);
      Job::GetValue(&local_b8,*ppJVar4);
      Interpreter::Value::ToString_abi_cxx11_(local_70,&local_b8);
      ErrorMsg(this,uVar3,local_70);
      std::__cxx11::string::~string((string *)local_70);
      Interpreter::Value::~Value(&local_b8);
    }
    ppJVar4 = ppJVar4 + 1;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                ,0x2a8,"Interpreter::Value ot::commissioner::JobManager::CollectJobsValue()");
}

Assistant:

Interpreter::Value JobManager::CollectJobsValue()
{
    Interpreter::Value value;
    nlohmann::json     json;
    uint64_t           xpan;

    for (const auto &job : mJobPool)
    {
        ASSERT(job->IsStopped());
        if (job->GetValue().HasNoError())
        {
            xpan = job->GetXpanId();
            try
            {
                std::string valueStr = job->GetValue().ToString();
                if (valueStr.empty())
                {
                    // this may occur with non-dataset commands
                    // like 'start', 'stop', etc.
                    valueStr = "true";
                    // please note, this is where job-based execution
                    // is different from single command run when
                    // nothing but [done] is printed; we need to see a
                    // distinguished result per network
                }
                json[utils::Hex(xpan)] = nlohmann::json::parse(valueStr);
            } catch (std::exception &e)
            {
                ErrorMsg(xpan, e.what());
            }
        }
        else // produce error messages immediately before printing value
        {
            ErrorMsg(job->GetXpanId(), job->GetValue().ToString());
        }
    }
    value = json.dump(JSON_INDENT_DEFAULT);
    return value;
}